

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O0

void __thiscall
helics::BrokerApp::processArgs
          (BrokerApp *this,
          unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *app)

{
  bool bVar1;
  CoreType CVar2;
  uint uVar3;
  pointer phVar4;
  element_type *peVar5;
  undefined8 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000040;
  CoreType in_stack_0000004c;
  RegistrationFailure *anon_var_0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *remArgs;
  shared_ptr<helics::Broker> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff58;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff60;
  string_view in_stack_ffffffffffffff68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffa0;
  
  phVar4 = CLI::std::
           unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
           operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                       *)0x41fc71);
  helicsCLI11App::remainArgs_abi_cxx11_(phVar4);
  phVar4 = CLI::std::
           unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
           operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                       *)0x41fc8e);
  CVar2 = helicsCLI11App::getCoreType(phVar4);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_RDI);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  BrokerFactory::create(in_stack_0000004c,_anon_var_0,in_stack_00000040);
  std::shared_ptr<helics::Broker>::operator=
            ((shared_ptr<helics::Broker> *)in_RDI,in_stack_ffffffffffffff48);
  CLI::std::shared_ptr<helics::Broker>::~shared_ptr((shared_ptr<helics::Broker> *)0x41fd09);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffff60);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RDI);
  if (bVar1) {
    peVar5 = CLI::std::__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x41fe3e);
    uVar3 = (*peVar5->_vptr_Broker[4])();
    if ((uVar3 & 1) != 0) {
      return;
    }
  }
  uVar6 = __cxa_allocate_exception(0x28);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff60,(char *)CONCAT44(CVar2,in_stack_ffffffffffffff58));
  ConnectionFailure::ConnectionFailure
            ((ConnectionFailure *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff68);
  __cxa_throw(uVar6,&ConnectionFailure::typeinfo,ConnectionFailure::~ConnectionFailure);
}

Assistant:

void BrokerApp::processArgs(std::unique_ptr<helicsCLI11App>& app)
{
    auto& remArgs = app->remainArgs();
    try {
        broker = BrokerFactory::create(app->getCoreType(), name, remArgs);
    }
    catch (const helics::RegistrationFailure&) {
        if (!name.empty()) {
            broker = BrokerFactory::findBroker(name);
            if (broker) {
                return;
            }
        }
    }
    if (!broker || !broker->isConnected()) {
        throw(ConnectionFailure("Broker is unable to connect\n"));
    }
}